

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdemon.cpp
# Opt level: O2

void my_create_demon(Am_Object *self)

{
  Am_Object_Demon *pAVar1;
  ostream *poVar2;
  char c;
  Am_Object local_20;
  
  if (proto_create != (Am_Object_Demon *)0x0) {
    poVar2 = std::ostream::_M_insert<bool>(true);
    std::operator<<(poVar2,"Id the fn ptr\n");
    std::ostream::flush();
    std::operator>>((istream *)&std::cin,&c);
    pAVar1 = proto_create;
    Am_Object::Am_Object(&local_20,self);
    (*pAVar1)((Am_Object_Data *)&local_20);
    Am_Object::~Am_Object(&local_20);
  }
  poVar2 = (ostream *)operator<<((ostream *)&std::cout,self);
  std::operator<<(poVar2," was created!!\n");
  return;
}

Assistant:

void
my_create_demon(Am_Object self)
{
  if (proto_create != nullptr) {
    char c;
    cout << proto_create << "Id the fn ptr\n" << flush;
    cin >> c;
    proto_create(self); // Call prototype create demon.
  }
  // Do my own code.
  cout << self << " was created!!\n";
}